

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

bool __thiscall
Ptex::v2_4::PtexReader::readZipBlock(PtexReader *this,void *data,int zipsize,int unzipsize)

{
  uLong uVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  Bytef aBStackY_4058 [19];
  undefined1 in_stack_ffffffffffffbfbb;
  int in_stack_ffffffffffffbfbc;
  void *in_stack_ffffffffffffbfc0;
  PtexReader *in_stack_ffffffffffffbfc8;
  char *in_stack_ffffffffffffbff8;
  PtexReader *in_stack_ffffffffffffc000;
  uInt local_4c;
  int total;
  int zresult;
  int size;
  void *buff;
  int unzipsize_local;
  int zipsize_local;
  void *data_local;
  PtexReader *this_local;
  
  if ((-1 < zipsize) && (-1 < unzipsize)) {
    if ((this->_zstream).state == (internal_state *)0x0) {
      inflateInit_(&this->_zstream,"1.2.11",0x70);
    }
    (this->_zstream).next_out = (Bytef *)data;
    (this->_zstream).avail_out = unzipsize;
    buff._4_4_ = zipsize;
    do {
      if ((int)buff._4_4_ < 0x4000) {
        local_4c = buff._4_4_;
      }
      else {
        local_4c = 0x4000;
      }
      buff._4_4_ = buff._4_4_ - local_4c;
      bVar2 = readBlock(in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc0,
                        in_stack_ffffffffffffbfbc,(bool)in_stack_ffffffffffffbfbb);
      if (!bVar2) {
LAB_009eed9d:
        uVar1 = (this->_zstream).total_out;
        inflateReset(&this->_zstream);
        return (int)uVar1 == unzipsize;
      }
      (this->_zstream).next_in = aBStackY_4058;
      (this->_zstream).avail_in = local_4c;
      uVar4 = 4;
      if (buff._4_4_ != 0) {
        uVar4 = 0;
      }
      iVar3 = inflate(&this->_zstream,uVar4);
      if (iVar3 == 1) goto LAB_009eed9d;
    } while (iVar3 == 0);
    setError(in_stack_ffffffffffffc000,in_stack_ffffffffffffbff8);
    inflateReset(&this->_zstream);
  }
  return false;
}

Assistant:

bool PtexReader::readZipBlock(void* data, int zipsize, int unzipsize)
{
    if (zipsize < 0 || unzipsize < 0) return false;
    if (!_zstream.state) {
        inflateInit(&_zstream);
    }

    void* buff = alloca(BlockSize);
    _zstream.next_out = (Bytef*) data;
    _zstream.avail_out = unzipsize;

    while (1) {
        int size = (zipsize < BlockSize) ? zipsize : BlockSize;
        zipsize -= size;
        if (!readBlock(buff, size)) break;
        _zstream.next_in = (Bytef*) buff;
        _zstream.avail_in = size;
        int zresult = inflate(&_zstream, zipsize ? Z_NO_FLUSH : Z_FINISH);
        if (zresult == Z_STREAM_END) break;
        if (zresult != Z_OK) {
            setError("PtexReader error: unzip failed, file corrupt");
            inflateReset(&_zstream);
            return 0;
        }
    }

    int total = (int)_zstream.total_out;
    inflateReset(&_zstream);
    return total == unzipsize;
}